

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_Vx_annotation.cpp
# Opt level: O1

ON_OBSOLETE_V2_Leader *
ON_OBSOLETE_V2_Leader::CreateFromV5Leader
          (ON_OBSOLETE_V5_Leader *V5_leader,ON_3dmAnnotationContext *annotation_context,
          ON_OBSOLETE_V2_Leader *destination)

{
  if (destination == (ON_OBSOLETE_V2_Leader *)0x0) {
    destination = (ON_OBSOLETE_V2_Leader *)operator_new(200);
    ON_OBSOLETE_V2_Leader(destination);
  }
  ON_OBSOLETE_V2_Annotation::Internal_InitializeFromV5Annotation
            (&destination->super_ON_OBSOLETE_V2_Annotation,
             &V5_leader->super_ON_OBSOLETE_V5_Annotation,annotation_context);
  return (ON_OBSOLETE_V2_Leader *)&destination->super_ON_OBSOLETE_V2_Annotation;
}

Assistant:

ON_OBSOLETE_V2_Leader* ON_OBSOLETE_V2_Leader::CreateFromV5Leader(
  const class ON_OBSOLETE_V5_Leader& V5_leader,
  const ON_3dmAnnotationContext* annotation_context,
  ON_OBSOLETE_V2_Leader* destination
)
{
  ON_OBSOLETE_V2_Leader* V2_leader 
    = (nullptr != destination)
    ? destination
    : new ON_OBSOLETE_V2_Leader();  

  V2_leader->Internal_InitializeFromV5Annotation(V5_leader,annotation_context);

  return V2_leader;
}